

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

QStringList * __thiscall QUrlModel::mimeTypes(QUrlModel *this)

{
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QLatin1String *this_00;
  QLatin1String local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QLatin1String::QLatin1String(&local_18,(char *)in_RDI);
  QList<QString>::QList<QLatin1String,void>((QList<QString> *)this_00,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QUrlModel::mimeTypes() const
{
    return QStringList(QLatin1StringView(uriListMimeType));
}